

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O0

_Bool operator_float_cmp(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  double dVar1;
  gravity_value_t value;
  gravity_value_t value_00;
  gravity_value_t value_01;
  gravity_value_t value_02;
  gravity_fiber_t *fiber;
  char local_1058 [8];
  char _buffer [4096];
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_50;
  gravity_value_t v2;
  gravity_value_t v1;
  uint32_t rindex_local;
  uint16_t nargs_local;
  gravity_value_t *args_local;
  gravity_vm *vm_local;
  
  dVar1 = (args->field_1).f;
  join_0x00000010_0x00000000_ = convert_value2float(vm,args[1]);
  if (_buffer._4088_8_ == 0) {
    snprintf(local_1058,0x1000,"Unable to convert object to Float");
    fiber = gravity_vm_fiber(vm);
    gravity_fiber_seterror(fiber,local_1058);
    value_02.field_1.n = 0;
    value_02.isa = gravity_class_null;
    gravity_vm_setslot(vm,value_02,rindex);
    return false;
  }
  if (_buffer._4088_8_ != 0) {
    if ((dVar1 == local_50.f) && (!NAN(dVar1) && !NAN(local_50.f))) {
      value_01.field_1.n = 0;
      value_01.isa = gravity_class_int;
      gravity_vm_setslot(vm,value_01,rindex);
      return true;
    }
    if (local_50.f < dVar1) {
      value_00.field_1.n = 1;
      value_00.isa = gravity_class_int;
      gravity_vm_setslot(vm,value_00,rindex);
      return true;
    }
  }
  value.field_1.n = -1;
  value.isa = gravity_class_int;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool operator_float_cmp (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)

    DECLARE_2VARIABLES(v1, v2, 0, 1);
    INTERNAL_CONVERT_FLOAT(v2, true);
    
    // simpler equality test
    if (VALUE_ISA_VALID(v2)) {
        if (v1.f == v2.f) RETURN_VALUE(VALUE_FROM_INT(0), rindex);
        if (v1.f > v2.f) RETURN_VALUE(VALUE_FROM_INT(1), rindex);
    }
    
    RETURN_VALUE(VALUE_FROM_INT(-1), rindex);
}